

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFFormFieldObjectHelper::getDefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  allocator<char> local_39;
  string local_38;
  QPDFFormFieldObjectHelper *local_18;
  QPDFFormFieldObjectHelper *this_local;
  
  local_18 = this;
  this_local = (QPDFFormFieldObjectHelper *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"/DV",&local_39);
  getInheritableFieldValueAsString(__return_storage_ptr__,this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getDefaultValueAsString()
{
    return getInheritableFieldValueAsString("/DV");
}